

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlNoNetExists(char *filename)

{
  int iVar1;
  int iVar2;
  char *fromUri;
  stat stat_buffer;
  char *local_b0;
  stat64 local_a8;
  
  iVar2 = 0;
  if (filename != (char *)0x0) {
    iVar1 = xmlConvertUriToPath(filename,&local_b0);
    iVar2 = 0;
    if (-1 < iVar1) {
      if (local_b0 != (char *)0x0) {
        filename = local_b0;
      }
      iVar1 = stat64(filename,&local_a8);
      iVar2 = 0;
      if (-1 < iVar1) {
        iVar2 = ((local_a8.st_mode & 0xf000) == 0x4000) + 1;
      }
      (*xmlFree)(local_b0);
    }
  }
  return iVar2;
}

Assistant:

int
xmlNoNetExists(const char *filename) {
    char *fromUri;
    int ret;

    if (filename == NULL)
	return(0);

    if (xmlConvertUriToPath(filename, &fromUri) < 0)
        return(0);

    if (fromUri != NULL)
        filename = fromUri;

    ret =  xmlCheckFilename(filename);

    xmlFree(fromUri);
    return(ret);
}